

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall cmPauseContext::Step(cmPauseContext *this)

{
  runtime_error *this_00;
  
  if ((this->Lock)._M_owns != false) {
    (*this->Debugger->_vptr_cmDebugger[3])();
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Attempt to step with invalid context");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void cmPauseContext::Step()
{
  if (!*this) {
    throw std::runtime_error("Attempt to step with invalid context");
  }
  Debugger->Step();
}